

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int FnMeanSigma_float(float *array,long npix,int nullcheck,float nullvalue,long *ngoodpix,
                     double *mean,double *sigma,int *status)

{
  double dVar1;
  double xtemp;
  double sum2;
  double sum;
  float *value;
  long ngood;
  long ii;
  double *sigma_local;
  double *mean_local;
  long *ngoodpix_local;
  float nullvalue_local;
  int nullcheck_local;
  long npix_local;
  float *array_local;
  
  value = (float *)0x0;
  sum2 = 0.0;
  xtemp = 0.0;
  sum = (double)array;
  if (nullcheck == 0) {
    for (ngood = 0; value = (float *)npix, ngood < npix; ngood = ngood + 1) {
      dVar1 = (double)*(float *)sum;
      sum2 = dVar1 + sum2;
      xtemp = dVar1 * dVar1 + xtemp;
      sum = (double)((long)sum + 4);
    }
  }
  else {
    for (ngood = 0; ngood < npix; ngood = ngood + 1) {
      if ((*(float *)sum != nullvalue) || (NAN(*(float *)sum) || NAN(nullvalue))) {
        value = (float *)((long)value + 1);
        dVar1 = (double)*(float *)sum;
        sum2 = dVar1 + sum2;
        xtemp = dVar1 * dVar1 + xtemp;
      }
      sum = (double)((long)sum + 4);
    }
  }
  if ((long)value < 2) {
    if (value == (float *)0x1) {
      if (ngoodpix != (long *)0x0) {
        *ngoodpix = 1;
      }
      if (mean != (double *)0x0) {
        *mean = sum2;
      }
      if (sigma != (double *)0x0) {
        *sigma = 0.0;
      }
    }
    else {
      if (ngoodpix != (long *)0x0) {
        *ngoodpix = 0;
      }
      if (mean != (double *)0x0) {
        *mean = 0.0;
      }
      if (sigma != (double *)0x0) {
        *sigma = 0.0;
      }
    }
  }
  else {
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = (long)value;
    }
    dVar1 = sum2 / (double)(long)value;
    if (mean != (double *)0x0) {
      *mean = dVar1;
    }
    if (sigma != (double *)0x0) {
      dVar1 = sqrt(-dVar1 * dVar1 + xtemp / (double)(long)value);
      *sigma = dVar1;
    }
  }
  return *status;
}

Assistant:

static int FnMeanSigma_float
       (float *array,       /*  2 dimensional array of image pixels */
        long npix,          /* number of pixels in the image */
	int nullcheck,      /* check for null values, if true */
	float nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters */
   
	long *ngoodpix,     /* number of non-null pixels in the image */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	int *status)        /* error status */

/*
Compute mean and RMS sigma of the non-null pixels in the input array.
*/
{
	long ii, ngood = 0;
	float *value;
	double sum = 0., sum2 = 0., xtemp;

	value = array;
	    
	if (nullcheck) {
	        for (ii = 0; ii < npix; ii++, value++) {
		    if (*value != nullvalue) {
		        ngood++;
		        xtemp = (double) *value;
		        sum += xtemp;
		        sum2 += (xtemp * xtemp);
		    }
		}
	} else {
	        ngood = npix;
	        for (ii = 0; ii < npix; ii++, value++) {
		        xtemp = (double) *value;
		        sum += xtemp;
		        sum2 += (xtemp * xtemp);
		}
	}

	if (ngood > 1) {
		if (ngoodpix) *ngoodpix = ngood;
		xtemp = sum / ngood;
		if (mean)     *mean = xtemp;
		if (sigma)    *sigma = sqrt((sum2 / ngood) - (xtemp * xtemp));
	} else if (ngood == 1){
		if (ngoodpix) *ngoodpix = 1;
		if (mean)     *mean = sum;
		if (sigma)    *sigma = 0.0;
	} else {
		if (ngoodpix) *ngoodpix = 0;
	        if (mean)     *mean = 0.;
		if (sigma)    *sigma = 0.;
	}	    
	return(*status);
}